

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::~basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
              *this)

{
  _Base_ptr *pp_Var1;
  undefined1 *puVar2;
  ushort uVar3;
  ulong uVar4;
  object_t *poVar5;
  
  if (((byte)(this->m_type).data & 0xf) == 3) {
    poVar5 = (object_t *)(this->m_value).array;
    puVar2 = *(undefined1 **)&(poVar5->_M_t)._M_impl;
    pp_Var1 = &(poVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)puVar2 != pp_Var1) {
      operator_delete(puVar2,(ulong)((long)&(*pp_Var1)->_M_color + 1));
      poVar5 = (this->m_value).object;
    }
    uVar4 = 0x20;
  }
  else {
    uVar3 = (this->m_type).data & 0xf;
    if (uVar3 == 2) {
      std::
      vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
      ::~vector((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>
                 *)(this->m_value).object);
      poVar5 = (this->m_value).object;
      uVar4 = 0x18;
    }
    else {
      if (uVar3 != 1) {
        return;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>_>_>_>
      ::~_Rb_tree(&((this->m_value).object)->_M_t);
      poVar5 = (this->m_value).object;
      uVar4 = 0x30;
    }
  }
  operator_delete(poVar5,uVar4);
  return;
}

Assistant:

~basic_json()
        {
            switch (m_type)
            {
                case value_t::object:
                {
                    AllocatorType<object_t> alloc;
                    alloc.destroy(m_value.object);
                    alloc.deallocate(m_value.object, 1);
                    break;
                }

                case value_t::array:
                {
                    AllocatorType<array_t> alloc;
                    alloc.destroy(m_value.array);
                    alloc.deallocate(m_value.array, 1);
                    break;
                }

                case value_t::string:
                {
                    AllocatorType<string_t> alloc;
                    alloc.destroy(m_value.string);
                    alloc.deallocate(m_value.string, 1);
                    break;
                }

                default:
                {
                    // all other types need no specific destructor
                    break;
                }
            }
        }